

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t get_default_extended_decoration(ExtendedDecorations decoration)

{
  uint32_t local_c;
  ExtendedDecorations decoration_local;
  
  if ((decoration == SPIRVCrossDecorationInterfaceMemberIndex) ||
     (decoration - SPIRVCrossDecorationResourceIndexPrimary < 4)) {
    local_c = 0xffffffff;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static uint32_t get_default_extended_decoration(ExtendedDecorations decoration)
{
	switch (decoration)
	{
	case SPIRVCrossDecorationResourceIndexPrimary:
	case SPIRVCrossDecorationResourceIndexSecondary:
	case SPIRVCrossDecorationResourceIndexTertiary:
	case SPIRVCrossDecorationResourceIndexQuaternary:
	case SPIRVCrossDecorationInterfaceMemberIndex:
		return ~(0u);

	default:
		return 0;
	}
}